

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.h
# Opt level: O3

void __thiscall CGL::Matrix3x3::Matrix3x3(Matrix3x3 *this)

{
  double *pdVar1;
  int j;
  int j_00;
  int i;
  int i_00;
  double dVar2;
  
  this->entries[0].field_0.field_0.x = 0.0;
  this->entries[0].field_0.field_0.y = 0.0;
  i_00 = 0;
  this->entries[0].field_0.field_0.z = 0.0;
  this->entries[1].field_0.field_0.x = 0.0;
  this->entries[1].field_0.field_0.y = 0.0;
  this->entries[1].field_0.field_0.z = 0.0;
  this->entries[2].field_0.field_0.x = 0.0;
  this->entries[2].field_0.field_0.y = 0.0;
  this->entries[2].field_0.field_0.z = 0.0;
  do {
    j_00 = 0;
    do {
      dVar2 = 1.0;
      if (i_00 != j_00) {
        dVar2 = 0.0;
      }
      pdVar1 = operator()(this,i_00,j_00);
      *pdVar1 = dVar2;
      j_00 = j_00 + 1;
    } while (j_00 != 3);
    i_00 = i_00 + 1;
  } while (i_00 != 3);
  return;
}

Assistant:

Matrix3x3(void) { 
    for( int i = 0; i < 3; i++ ) {
      for( int j = 0; j < 3; j++ ) {
        (*this)(i,j) = (i==j) ? 1. : 0.;
      }
    }
  }